

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

char * searchForTZFile(char *path,DefaultTZInfo *tzInfo)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  CharString *this;
  dirent *pdVar4;
  char *pcVar5;
  CharString *local_118;
  char *local_100;
  char *zoneid;
  DIR *pDStack_f0;
  int32_t amountToSkip;
  DIR *subDirp;
  undefined1 local_e0 [8];
  CharString newpath;
  char *dirName;
  undefined1 local_78 [8];
  CharString curpath;
  char *pcStack_30;
  UErrorCode status;
  char *result;
  dirent *dirEntry;
  DIR *dirp;
  DefaultTZInfo *tzInfo_local;
  char *path_local;
  
  dirEntry = (dirent *)0x0;
  pcStack_30 = (char *)0x0;
  curpath._60_4_ = 0;
  pcVar5 = path;
  icu_63::CharString::CharString((CharString *)local_78,path,-1,(UErrorCode *)&curpath.field_0x3c);
  UVar1 = U_FAILURE(curpath._60_4_);
  if ((UVar1 == '\0') && (dirEntry = (dirent *)opendir(path), dirEntry != (dirent *)0x0)) {
    if (gSearchTZFileResult == (CharString *)0x0) {
      this = (CharString *)icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar5);
      local_118 = (CharString *)0x0;
      if (this != (CharString *)0x0) {
        icu_63::CharString::CharString(this);
        local_118 = this;
      }
      gSearchTZFileResult = local_118;
      if (local_118 == (CharString *)0x0) goto LAB_00353044;
      ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
    }
    do {
      do {
        pdVar4 = readdir((DIR *)dirEntry);
        if (pdVar4 == (dirent *)0x0) goto LAB_00353044;
        newpath._56_8_ = pdVar4->d_name;
        iVar2 = strcmp((char *)newpath._56_8_,".");
      } while ((iVar2 == 0) || (iVar2 = strcmp((char *)newpath._56_8_,".."), iVar2 == 0));
      icu_63::CharString::CharString
                ((CharString *)local_e0,(CharString *)local_78,(UErrorCode *)&curpath.field_0x3c);
      icu_63::CharString::append
                ((CharString *)local_e0,(char *)newpath._56_8_,-1,(UErrorCode *)&curpath.field_0x3c)
      ;
      UVar1 = U_FAILURE(curpath._60_4_);
      if (UVar1 == '\0') {
        pDStack_f0 = (DIR *)0x0;
        pcVar5 = icu_63::CharString::data((CharString *)local_e0);
        pDStack_f0 = opendir(pcVar5);
        if (pDStack_f0 == (DIR *)0x0) {
          iVar2 = strcmp("posixrules",(char *)newpath._56_8_);
          if ((iVar2 != 0) && (iVar2 = strcmp("localtime",(char *)newpath._56_8_), iVar2 != 0)) {
            pcVar5 = icu_63::CharString::data((CharString *)local_e0);
            UVar1 = compareBinaryFiles("/etc/localtime",pcVar5,tzInfo);
            if (UVar1 != '\0') {
              zoneid._4_4_ = 0x14;
              iVar3 = icu_63::CharString::length((CharString *)local_e0);
              if (iVar3 < 0x14) {
                zoneid._4_4_ = icu_63::CharString::length((CharString *)local_e0);
              }
              local_100 = icu_63::CharString::data((CharString *)local_e0);
              local_100 = local_100 + zoneid._4_4_;
              skipZoneIDPrefix(&local_100);
              icu_63::CharString::clear(gSearchTZFileResult);
              icu_63::CharString::append
                        (gSearchTZFileResult,local_100,-1,(UErrorCode *)&curpath.field_0x3c);
              UVar1 = U_FAILURE(curpath._60_4_);
              if (UVar1 == '\0') {
                pcStack_30 = icu_63::CharString::data(gSearchTZFileResult);
                subDirp._4_4_ = 4;
              }
              else {
                subDirp._4_4_ = 4;
              }
              goto LAB_00353021;
            }
          }
LAB_00353017:
          subDirp._4_4_ = 0;
        }
        else {
          closedir(pDStack_f0);
          icu_63::CharString::append((CharString *)local_e0,'/',(UErrorCode *)&curpath.field_0x3c);
          UVar1 = U_FAILURE(curpath._60_4_);
          if (UVar1 == '\0') {
            pcVar5 = icu_63::CharString::data((CharString *)local_e0);
            pcStack_30 = searchForTZFile(pcVar5,tzInfo);
            if (pcStack_30 == (char *)0x0) goto LAB_00353017;
            subDirp._4_4_ = 4;
          }
          else {
            subDirp._4_4_ = 4;
          }
        }
      }
      else {
        subDirp._4_4_ = 4;
      }
LAB_00353021:
      icu_63::CharString::~CharString((CharString *)local_e0);
    } while (subDirp._4_4_ == 0);
  }
LAB_00353044:
  if (dirEntry != (dirent *)0x0) {
    closedir((DIR *)dirEntry);
  }
  subDirp._4_4_ = 1;
  icu_63::CharString::~CharString((CharString *)local_78);
  return pcStack_30;
}

Assistant:

static char* searchForTZFile(const char* path, DefaultTZInfo* tzInfo) {
    DIR* dirp = NULL;
    struct dirent* dirEntry = NULL;
    char* result = NULL;
    UErrorCode status = U_ZERO_ERROR;

    /* Save the current path */
    CharString curpath(path, -1, status);
    if (U_FAILURE(status)) {
        goto cleanupAndReturn;
    }

    dirp = opendir(path);
    if (dirp == NULL) {
        goto cleanupAndReturn;
    }

    if (gSearchTZFileResult == NULL) {
        gSearchTZFileResult = new CharString;
        if (gSearchTZFileResult == NULL) {
            goto cleanupAndReturn;
        }
        ucln_common_registerCleanup(UCLN_COMMON_PUTIL, putil_cleanup);
    }

    /* Check each entry in the directory. */
    while((dirEntry = readdir(dirp)) != NULL) {
        const char* dirName = dirEntry->d_name;
        if (uprv_strcmp(dirName, SKIP1) != 0 && uprv_strcmp(dirName, SKIP2) != 0) {
            /* Create a newpath with the new entry to test each entry in the directory. */
            CharString newpath(curpath, status);
            newpath.append(dirName, -1, status);
            if (U_FAILURE(status)) {
                break;
            }

            DIR* subDirp = NULL;
            if ((subDirp = opendir(newpath.data())) != NULL) {
                /* If this new path is a directory, make a recursive call with the newpath. */
                closedir(subDirp);
                newpath.append('/', status);
                if (U_FAILURE(status)) {
                    break;
                }
                result = searchForTZFile(newpath.data(), tzInfo);
                /*
                 Have to get out here. Otherwise, we'd keep looking
                 and return the first match in the top-level directory
                 if there's a match in the top-level. If not, this function
                 would return NULL and set gTimeZoneBufferPtr to NULL in initDefault().
                 It worked without this in most cases because we have a fallback of calling
                 localtime_r to figure out the default timezone.
                */
                if (result != NULL)
                    break;
            } else if (uprv_strcmp(TZFILE_SKIP, dirName) != 0 && uprv_strcmp(TZFILE_SKIP2, dirName) != 0) {
                if(compareBinaryFiles(TZDEFAULT, newpath.data(), tzInfo)) {
                    int32_t amountToSkip = sizeof(TZZONEINFO) - 1;
                    if (amountToSkip > newpath.length()) {
                        amountToSkip = newpath.length();
                    }
                    const char* zoneid = newpath.data() + amountToSkip;
                    skipZoneIDPrefix(&zoneid);
                    gSearchTZFileResult->clear();
                    gSearchTZFileResult->append(zoneid, -1, status);
                    if (U_FAILURE(status)) {
                        break;
                    }
                    result = gSearchTZFileResult->data();
                    /* Get out after the first one found. */
                    break;
                }
            }
        }
    }

  cleanupAndReturn:
    if (dirp) {
        closedir(dirp);
    }
    return result;
}